

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test::
~ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test
          (ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test *this)

{
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::~DescriptorPool(&(this->super_ValidationErrorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, EnumOptionValueIsSiblingEnumValueName) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "enum_type { name: \"FooEnum1\" value { name: \"BAR\" number: 1 } "
      "                               value { name: \"BAZ\" number: 2 } }"
      "enum_type { name: \"FooEnum2\" value { name: \"MOO\" number: 1 } "
      "                               value { name: \"MOOO\" number: 2 } }"
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_ENUM type_name: \"FooEnum1\" "
      "            extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 identifier_value: \"MOOO\" } }",

      "foo.proto: foo.proto: OPTION_VALUE: Enum type \"FooEnum1\" has no value "
      "named \"MOOO\" for option \"foo\". This appears to be a value from a "
      "sibling type.\n");
}